

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O3

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadBone(OgreBinarySerializer *this,Skeleton *skeleton)

{
  pointer *pppBVar1;
  int8_t *piVar2;
  undefined8 uVar3;
  float *pfVar4;
  iterator __position;
  float fVar5;
  float fVar6;
  float fVar7;
  unsigned_short uVar8;
  Bone *this_00;
  Logger *this_01;
  runtime_error *this_02;
  Bone *bone;
  Bone *local_1c0;
  char *local_1b8 [2];
  char local_1a8 [16];
  undefined1 local_198 [376];
  
  this_00 = (Bone *)operator_new(0xf8);
  Bone::Bone(this_00);
  local_1c0 = this_00;
  ReadLine_abi_cxx11_((string *)local_198,this);
  std::__cxx11::string::operator=((string *)&this_00->name,(string *)local_198);
  if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
    operator_delete((void *)local_198._0_8_);
  }
  uVar8 = StreamReader<false,_false>::Get<unsigned_short>(this->m_reader);
  this_00->id = uVar8;
  piVar2 = this->m_reader->current;
  StreamReader<false,_false>::SetPtr(this->m_reader,piVar2 + 0xc);
  (this_00->position).z = *(float *)(piVar2 + 8);
  uVar3 = *(undefined8 *)piVar2;
  (this_00->position).x = (float)(int)uVar3;
  (this_00->position).y = (float)(int)((ulong)uVar3 >> 0x20);
  pfVar4 = (float *)this->m_reader->current;
  StreamReader<false,_false>::SetPtr(this->m_reader,(int8_t *)(pfVar4 + 4));
  fVar5 = *pfVar4;
  fVar6 = pfVar4[1];
  fVar7 = pfVar4[2];
  (this_00->rotation).w = pfVar4[3];
  (this_00->rotation).x = fVar5;
  (this_00->rotation).y = fVar6;
  (this_00->rotation).z = fVar7;
  if (0x24 < this->m_currentLen) {
    piVar2 = this->m_reader->current;
    StreamReader<false,_false>::SetPtr(this->m_reader,piVar2 + 0xc);
    (this_00->scale).z = *(float *)(piVar2 + 8);
    uVar3 = *(undefined8 *)piVar2;
    (this_00->scale).x = (float)(int)uVar3;
    (this_00->scale).y = (float)(int)((ulong)uVar3 >> 0x20);
  }
  if ((long)(skeleton->bones).
            super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(skeleton->bones).
            super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>._M_impl.
            super__Vector_impl_data._M_start >> 3 == (ulong)this_00->id) {
    this_01 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[5]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
               (char (*) [5])0x737079);
    std::ostream::_M_insert<unsigned_long>((ulong)local_198);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198," ",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,(this_00->name)._M_dataplus._M_p,
               (this_00->name)._M_string_length);
    std::__cxx11::stringbuf::str();
    Logger::debug(this_01,local_1b8[0]);
    if (local_1b8[0] != local_1a8) {
      operator_delete(local_1b8[0]);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
    __position._M_current =
         (skeleton->bones).
         super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (skeleton->bones).
        super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Assimp::Ogre::Bone*,std::allocator<Assimp::Ogre::Bone*>>::
      _M_realloc_insert<Assimp::Ogre::Bone*const&>
                ((vector<Assimp::Ogre::Bone*,std::allocator<Assimp::Ogre::Bone*>> *)skeleton,
                 __position,&local_1c0);
    }
    else {
      *__position._M_current = this_00;
      pppBVar1 = &(skeleton->bones).
                  super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppBVar1 = *pppBVar1 + 1;
    }
    return;
  }
  this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"Ogre Skeleton bone indexes not contiguous. Error at bone index ",
             0x3f);
  std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_02,(string *)local_1b8);
  *(undefined ***)this_02 = &PTR__runtime_error_008dc448;
  __cxa_throw(this_02,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void OgreBinarySerializer::ReadBone(Skeleton *skeleton)
{
    Bone *bone = new Bone();
    bone->name = ReadLine();
    bone->id = Read<uint16_t>();

    // Pos and rot
    ReadVector(bone->position);
    ReadQuaternion(bone->rotation);

    // Scale (optional)
    if (m_currentLen > MSTREAM_BONE_SIZE_WITHOUT_SCALE)
        ReadVector(bone->scale);

    // Bone indexes need to start from 0 and be contiguous
    if (bone->id != skeleton->bones.size()) {
        throw DeadlyImportError(Formatter::format() << "Ogre Skeleton bone indexes not contiguous. Error at bone index " << bone->id);
    }

    ASSIMP_LOG_DEBUG_F( "    ", bone->id, " ", bone->name);

    skeleton->bones.push_back(bone);
}